

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void RadialFetchPlain<GradientBaseFP>::fetch
               (BlendType *buffer,BlendType *end,Operator *op,QSpanData *data,qreal det,
               qreal delta_det,qreal delta_delta_det,qreal b,qreal delta_b)

{
  double dVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Type TVar6;
  
  if ((op->field_16).radial.extended == false) {
    if (buffer < end) {
      do {
        fVar2 = 0.0;
        fVar3 = 0.0;
        uVar5 = 0;
        if (det >= 0.0) {
          if (det < 0.0) {
            dVar1 = sqrt(det);
          }
          else {
            dVar1 = SQRT(det);
          }
          TVar6 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar1 - b);
          uVar5 = TVar6._8_8_;
          fVar2 = TVar6.r;
          fVar3 = TVar6.g;
        }
        buffer->r = fVar2;
        buffer->g = fVar3;
        buffer->b = (float)uVar5;
        buffer->a = (float)((ulong)uVar5 >> 0x20);
        det = det + delta_det;
        delta_det = delta_det + delta_delta_det;
        b = b + delta_b;
        buffer = buffer + 1;
      } while (buffer < end);
    }
  }
  else if (buffer < end) {
    do {
      uVar5 = 0;
      if (det < 0.0) {
        uVar4 = 0;
      }
      else {
        if (det < 0.0) {
          dVar1 = sqrt(det);
        }
        else {
          dVar1 = SQRT(det);
        }
        uVar5 = 0;
        uVar4 = 0;
        if (0.0 <= (op->field_16).linear.l * (dVar1 - b) + *(double *)((long)&data->field_23 + 0x30)
           ) {
          TVar6 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar1 - b);
          uVar4 = TVar6._8_8_;
          uVar5 = TVar6._0_8_;
        }
      }
      buffer->r = (float)(int)uVar5;
      buffer->g = (float)(int)((ulong)uVar5 >> 0x20);
      buffer->b = (float)(int)uVar4;
      buffer->a = (float)(int)((ulong)uVar4 >> 0x20);
      det = det + delta_det;
      delta_det = delta_det + delta_delta_det;
      b = b + delta_b;
      buffer = buffer + 1;
    } while (buffer < end);
  }
  return;
}

Assistant:

static void fetch(BlendType *buffer, BlendType *end,
                      const Operator *op, const QSpanData *data, qreal det,
                      qreal delta_det, qreal delta_delta_det, qreal b, qreal delta_b)
    {
        if (op->radial.extended) {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    if (data->gradient.radial.focal.radius + op->radial.dr * w >= 0)
                        result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;

                ++buffer;
            }
        } else {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer++ = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;
            }
        }
    }